

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  char *__dest;
  ImGuiContext *pIVar1;
  char *pcVar2;
  ImGuiSettingsHandler *pIVar3;
  char *pcVar4;
  ImGuiSettingsHandler *pIVar5;
  size_t in_RSI;
  char *in_RDI;
  ImGuiSettingsHandler *handler_1;
  ImGuiSettingsHandler *__end1_1;
  ImGuiSettingsHandler *__begin1_1;
  ImVector<ImGuiSettingsHandler> *__range1_1;
  char *name_start;
  char *type_end;
  char *type_start;
  char *name_end;
  char *line;
  char *line_end;
  ImGuiSettingsHandler *entry_handler;
  void *entry_data;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *__end1;
  ImGuiSettingsHandler *__begin1;
  ImVector<ImGuiSettingsHandler> *__range1;
  char *buf_end;
  char *buf;
  ImGuiContext *g;
  int in_stack_ffffffffffffff3c;
  ImVector<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  uint6 in_stack_ffffffffffffff50;
  undefined1 uVar6;
  undefined1 uVar7;
  char *in_stack_ffffffffffffff68;
  char *local_68;
  char *local_60;
  ImGuiSettingsHandler *local_58;
  ImVector<char> *local_50;
  ImGuiSettingsHandler *local_38;
  size_t local_10;
  
  pIVar1 = GImGui;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = strlen(in_RDI);
  }
  ImVector<char>::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  __dest = (pIVar1->SettingsIniData).Buf.Data;
  pcVar2 = __dest + local_10;
  memcpy(__dest,in_RDI,local_10);
  *pcVar2 = '\0';
  local_38 = ImVector<ImGuiSettingsHandler>::begin(&pIVar1->SettingsHandlers);
  pIVar3 = ImVector<ImGuiSettingsHandler>::end(&pIVar1->SettingsHandlers);
  for (; local_38 != pIVar3; local_38 = local_38 + 1) {
    if (local_38->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*local_38->ReadInitFn)(pIVar1,local_38);
    }
  }
  local_50 = (ImVector<char> *)0x0;
  local_58 = (ImGuiSettingsHandler *)0x0;
  local_68 = __dest;
  while (local_68 < pcVar2) {
    while( true ) {
      uVar7 = true;
      if (*local_68 != '\n') {
        uVar7 = *local_68 == '\r';
      }
      if ((bool)uVar7 == false) break;
      local_68 = local_68 + 1;
    }
    local_60 = local_68;
    while( true ) {
      uVar6 = false;
      if ((local_60 < pcVar2) && (uVar6 = false, *local_60 != '\n')) {
        uVar6 = *local_60 != '\r';
      }
      if ((bool)uVar6 == false) break;
      local_60 = local_60 + 1;
    }
    *local_60 = '\0';
    if (*local_68 != ';') {
      if (((*local_68 == '[') && (local_68 < local_60)) && (local_60[-1] == ']')) {
        local_60[-1] = '\0';
        pcVar4 = ImStrchrRange((char *)(ulong)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                               (char)((ulong)in_stack_ffffffffffffff40 >> 0x38));
        if (pcVar4 == (char *)0x0) {
          in_stack_ffffffffffffff48 = (char *)0x0;
        }
        else {
          in_stack_ffffffffffffff48 =
               ImStrchrRange((char *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffff50)),
                             in_stack_ffffffffffffff48,
                             (char)((ulong)in_stack_ffffffffffffff40 >> 0x38));
          if (in_stack_ffffffffffffff48 != (char *)0x0) {
            *pcVar4 = '\0';
            pcVar4 = in_stack_ffffffffffffff48 + 1;
            local_58 = FindSettingsHandler(in_stack_ffffffffffffff68);
            if (local_58 == (ImGuiSettingsHandler *)0x0) {
              in_stack_ffffffffffffff40 = (ImVector<char> *)0x0;
              local_50 = in_stack_ffffffffffffff40;
            }
            else {
              in_stack_ffffffffffffff40 =
                   (ImVector<char> *)(*local_58->ReadOpenFn)(pIVar1,local_58,pcVar4);
              local_50 = in_stack_ffffffffffffff40;
            }
          }
        }
      }
      else if ((local_58 != (ImGuiSettingsHandler *)0x0) && (local_50 != (ImVector<char> *)0x0)) {
        (*local_58->ReadLineFn)(pIVar1,local_58,local_50,local_68);
      }
    }
    local_68 = local_60 + 1;
  }
  pIVar1->SettingsLoaded = true;
  memcpy(__dest,in_RDI,local_10);
  pIVar3 = ImVector<ImGuiSettingsHandler>::begin(&pIVar1->SettingsHandlers);
  pIVar5 = ImVector<ImGuiSettingsHandler>::end(&pIVar1->SettingsHandlers);
  for (; pIVar3 != pIVar5; pIVar3 = pIVar3 + 1) {
    if (pIVar3->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      (*pIVar3->ApplyAllFn)(pIVar1,pIVar3);
    }
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ReadInitFn != NULL)
            handler.ReadInitFn(&g, &handler);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ApplyAllFn != NULL)
            handler.ApplyAllFn(&g, &handler);
}